

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::FunctionBody(FunctionBody *this,ParseableFunctionInfo *proxy)

{
  Type TVar1;
  JavascriptMethod method;
  code *pcVar2;
  bool bVar3;
  Utf8SourceInfo *pUVar4;
  SRCINFO *pSVar5;
  SourceContextInfo *pSVar6;
  Recycler *pRVar7;
  FunctionEntryPointInfo *pFVar8;
  ThreadContext *pTVar9;
  undefined4 *puVar10;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *ptr;
  ProxyEntryPointInfo *pPVar11;
  TrackAllocData local_c0;
  CriticalSection *local_98;
  CriticalSection *syncObj;
  undefined8 local_88;
  TrackAllocData local_80;
  ScriptContext *local_58;
  ScriptContext *scriptContext;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  ParseableFunctionInfo *local_18;
  ParseableFunctionInfo *proxy_local;
  FunctionBody *this_local;
  
  local_18 = proxy;
  proxy_local = &this->super_ParseableFunctionInfo;
  ParseableFunctionInfo::ParseableFunctionInfo(&this->super_ParseableFunctionInfo,proxy);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0570;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::CompactCounters
            (&this->counters,this);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ByteBlock>::WriteBarrierPtr(&this->byteCodeBlock,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::WriteBarrierPtr(&this->entryPoints,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->m_constTable,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void_*>::WriteBarrierPtr(&this->inlineCaches,&local_38);
  InlineCachePointerArray<Js::PolymorphicInlineCache>::InlineCachePointerArray
            (&this->polymorphicInlineCaches);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<int>::WriteBarrierPtr(&this->cacheIdToPropertyIdMap,&local_40);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->m_inlineCacheTypes,&local_48);
  this->m_DEBUG_executionCount = 0;
  this->m_nativeEntryPointIsInterpreterThunk = false;
  this->regAllocStoreCount = 0;
  this->regAllocLoadCount = 0;
  this->callCountStats = 0;
  SourceInfo::SourceInfo(&this->m_sourceInfo);
  pUVar4 = FunctionProxy::GetUtf8SourceInfo(&local_18->super_FunctionProxy);
  pSVar5 = Utf8SourceInfo::GetSrcInfo(pUVar4);
  pSVar6 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&pSVar5->sourceContextInfo);
  this->m_uScriptId = pSVar6->sourceContextId;
  this->m_iProfileSession = -1;
  this->m_envDepth = 0xffff;
  this->m_argUsedForBranch = 0;
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  this->m_tag31 = true;
  this->m_hasFinally = false;
  this->hasScopeObject = false;
  this->hasCachedScopePropIds = false;
  this->field_0x178 = this->field_0x178 | 1;
  this->field_0x178 = this->field_0x178 & 0xfd;
  this->field_0x178 = this->field_0x178 & 0xfb;
  this->field_0x178 = this->field_0x178 & 0xf7;
  this->field_0x178 = this->field_0x178 & 0xef;
  this->field_0x178 = this->field_0x178 & 0xbf;
  this->field_0x178 = this->field_0x178 & 0x7f;
  this->field_0x179 = this->field_0x179 & 0xfe;
  this->field_0x179 = this->field_0x179 & 0xfd;
  this->field_0x179 = this->field_0x179 & 0xfb;
  this->field_0x179 = this->field_0x179 & 0xbf;
  this->field_0x179 = this->field_0x179 & 0x7f;
  this->field_0x17a = this->field_0x17a & 0xfe;
  this->field_0x17a = this->field_0x17a & 0xfd;
  this->field_0x17a = this->field_0x17a | 4;
  this->field_0x17a = this->field_0x17a & 0xf7;
  this->field_0x17a = this->field_0x17a & 0xef;
  this->field_0x17a = this->field_0x17a & 0xdf;
  this->field_0x17a = this->field_0x17a & 0xbf;
  this->field_0x17a = this->field_0x17a & 0x7f;
  this->field_0x17b = this->field_0x17b & 0xfe;
  this->field_0x17b = this->field_0x17b & 0xfd;
  this->field_0x17b = this->field_0x17b | 4;
  this->field_0x17b = this->field_0x17b & 0xf7;
  this->field_0x17b = this->field_0x17b & 0xef;
  this->field_0x17b = this->field_0x17b & 0xdf;
  this->field_0x17b = this->field_0x17b & 0xbf;
  this->field_0x17b = this->field_0x17b & 0x7f;
  this->field_0x17c = this->field_0x17c | 1;
  this->field_0x17c = this->field_0x17c & 0xfd;
  this->field_0x17c = this->field_0x17c & 0xfb;
  this->field_0x17c = this->field_0x17c & 0xf7;
  this->field_0x17c = this->field_0x17c & 0xef;
  this->field_0x17c = this->field_0x17c & 0xdf;
  this->field_0x17c = this->field_0x17c & 0xbf;
  this->field_0x17c = this->field_0x17c & 0x7f;
  this->field_0x17d = this->field_0x17d & 0xfe;
  this->field_0x17d = this->field_0x17d & 0xfd;
  this->field_0x17d = this->field_0x17d & 0xf7;
  this->field_0x17d = this->field_0x17d & 0xef;
  this->bailOnMisingProfileCount = '\0';
  this->bailOnMisingProfileRejitCount = '\0';
  this->inlineDepth = '\0';
  FunctionExecutionStateMachine::FunctionExecutionStateMachine(&this->executionState);
  this->m_depth = 0;
  this->loopInterpreterLimit = DAT_01eace48;
  this->debuggerScopeIndex = 0;
  this->savedPolymorphicCacheState = 0;
  this->byteCodeCache = (Type)0x0;
  Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierPtr
            (&this->defaultFunctionEntryPointInfo);
  scriptContext = (ScriptContext *)0x0;
  Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierPtr
            (&this->dynamicProfileInfo,&scriptContext);
  this->savedInlinerVersion = '\0';
  this->savedImplicitCallsFlags = ImplicitCall_HasNoInfo;
  this->m_asmJsTotalLoopCount = 0;
  local_58 = FunctionProxy::GetScriptContext(&local_18->super_FunctionProxy);
  SetCountField(this,ConstantCount,1);
  FunctionProxy::UpdateFunctionBodyImpl(&local_18->super_FunctionProxy,this);
  pRVar7 = ScriptContext::GetRecycler(local_58);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&FunctionEntryPointInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x2fe);
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_80);
  syncObj = (CriticalSection *)Memory::Recycler::AllocFinalizedInlined;
  local_88 = 0;
  pFVar8 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar7,0x4642b0);
  method = local_58->CurrentThunk;
  pTVar9 = ScriptContext::GetThreadContext(local_58);
  FunctionEntryPointInfo::FunctionEntryPointInfo(pFVar8,(FunctionProxy *)this,method,pTVar9);
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator=
            (&(this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo,
             (ProxyEntryPointInfo *)pFVar8);
  pFVar8 = (FunctionEntryPointInfo *)FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  SetDefaultFunctionEntryPointInfo(this,pFVar8,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
       *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xfffd | 2;
  pUVar4 = FunctionProxy::GetUtf8SourceInfo(&local_18->super_FunctionProxy);
  if (pUVar4 != (Utf8SourceInfo *)0x0) {
    TVar1 = this->m_uScriptId;
    pUVar4 = FunctionProxy::GetUtf8SourceInfo(&local_18->super_FunctionProxy);
    pSVar5 = Utf8SourceInfo::GetSrcInfo(pUVar4);
    pSVar6 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&pSVar5->sourceContextInfo);
    if (TVar1 != pSVar6->sourceContextId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x303,
                                  "(!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId)"
                                  ,
                                  "!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  pTVar9 = ScriptContext::GetThreadContext(local_58);
  local_98 = ThreadContext::GetFunctionBodyLock(pTVar9);
  pRVar7 = ScriptContext::GetRecycler(local_58);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c0,
             (type_info *)
             &SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x307);
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_c0);
  ptr = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)new<Memory::Recycler>(0x38,pRVar7,0x43c4b0);
  pRVar7 = ScriptContext::GetRecycler(local_58);
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
  ::SynchronizableList<Memory::Recycler*>
            ((SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              *)ptr,pRVar7,local_98);
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::operator=(&this->entryPoints,ptr);
  pFVar8 = GetDefaultFunctionEntryPointInfo(this);
  AddEntryPointToEntryPointList(this,pFVar8);
  pPVar11 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  if (pPVar11->jsMethod == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x30b,"(this->GetDefaultEntryPointInfo()->jsMethod != nullptr)",
                                "this->GetDefaultEntryPointInfo()->jsMethod != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  InitDisableInlineApply(this);
  InitDisableInlineSpread(this);
  return;
}

Assistant:

FunctionBody::FunctionBody(ParseableFunctionInfo * proxy) :
        ParseableFunctionInfo(proxy),
        counters(this),
        m_uScriptId(proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId),
        cleanedUp(false),
        sourceInfoCleanedUp(false),
        profiledLdLenCount(0),
        profiledLdElemCount(0),
        profiledStElemCount(0),
        profiledCallSiteCount(0),
        profiledArrayCallSiteCount(0),
        profiledDivOrRemCount(0),
        profiledSwitchCount(0),
        profiledReturnTypeCount(0),
        profiledSlotCount(0),
        m_isFuncRegistered(false),
        m_isFuncRegisteredToDiag(false),
        m_hasBailoutInstrInJittedCode(false),
        m_depth(0),
        inlineDepth(0),
        m_pendingLoopHeaderRelease(false),
        hasCachedScopePropIds(false),
        m_argUsedForBranch(0),
        m_envDepth((uint16)-1),
        loopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount)),
        savedPolymorphicCacheState(0),
        debuggerScopeIndex(0),
        m_hasFinally(false),
#if ENABLE_PROFILE_INFO
        dynamicProfileInfo(nullptr),
#endif
        savedInlinerVersion(0),
#if ENABLE_NATIVE_CODEGEN
        savedImplicitCallsFlags(ImplicitCall_HasNoInfo),
#endif
        hasExecutionDynamicProfileInfo(false),
        m_hasAllNonLocalReferenced(false),
        m_hasSetIsObject(false),
        m_hasFunExprNameReference(false),
        m_CallsEval(false),
        m_ChildCallsEval(false),
        m_hasReferenceableBuiltInArguments(false),
        m_isParamAndBodyScopeMerged(true),
        m_firstFunctionObject(true),
        m_inlineCachesOnFunctionObject(false),
        m_hasDoneAllNonLocalReferenced(false),
        m_hasFunctionCompiledSent(false),
        byteCodeCache(nullptr),
        m_hasLocalClosureRegister(false),
        m_hasParamClosureRegister(false),
        m_hasLocalFrameDisplayRegister(false),
        m_hasEnvRegister(false),
        m_hasThisRegisterForEventHandler(false),
        m_hasFirstInnerScopeRegister(false),
        m_hasFuncExprScopeRegister(false),
        m_hasFirstTmpRegister(false),
        m_hasActiveReference(false),
        m_tag31(true),
        m_tag32(true),
        m_tag33(true),
        m_nativeEntryPointUsed(false),
        hasDoneLoopBodyCodeGen(false),
        bailOnMisingProfileCount(0),
        bailOnMisingProfileRejitCount(0),
        byteCodeBlock(nullptr),
        entryPoints(nullptr),
        m_constTable(nullptr),
        inlineCaches(nullptr),
        cacheIdToPropertyIdMap(nullptr),
        wasCalledFromLoop(false),
        hasScopeObject(false),
        hasNestedLoop(false),
        recentlyBailedOutOfJittedLoopBody(false),
        m_isAsmJsScheduledForFullJIT(false),
        m_asmJsTotalLoopCount(0)
        //
        // Even if the function does not require any locals, we must always have "R0" to propagate
        // a return value.  By enabling this here, we avoid unnecessary conditionals during execution.
        //
#ifdef IR_VIEWER
        ,m_isIRDumpEnabled(false)
        ,m_irDumpBaseObject(nullptr)
#endif /* IR_VIEWER */
        , m_isFromNativeCodeModule(false)
        , hasHotLoop(false)
        , m_isPartialDeserializedFunction(false)
#if DBG
        , m_isSerialized(false)
#endif
#ifdef PERF_COUNTERS
        , m_isDeserializedFunction(false)
#endif
#if DBG
        , m_DEBUG_executionCount(0)
        , m_nativeEntryPointIsInterpreterThunk(false)
        , m_canDoStackNestedFunc(false)
        , m_inlineCacheTypes(nullptr)
        , m_iProfileSession(-1)
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        , regAllocLoadCount(0)
        , regAllocStoreCount(0)
        , callCountStats(0)
#endif
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();

        SetCountField(CounterFields::ConstantCount, 1);

        proxy->UpdateFunctionBodyImpl(this);

        this->m_defaultEntryPointInfo = RecyclerNewFinalized(scriptContext->GetRecycler(),
            FunctionEntryPointInfo, this, scriptContext->CurrentThunk, scriptContext->GetThreadContext());

        this->SetDefaultFunctionEntryPointInfo((FunctionEntryPointInfo*) this->GetDefaultEntryPointInfo(), DefaultEntryThunk);
        this->m_hasBeenParsed = true;

        Assert(!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId);

        // Sync entryPoints changes to etw rundown lock
        CriticalSection* syncObj = scriptContext->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(scriptContext->GetRecycler(), FunctionEntryPointList, scriptContext->GetRecycler(), syncObj);

        this->AddEntryPointToEntryPointList(this->GetDefaultFunctionEntryPointInfo());

        Assert(this->GetDefaultEntryPointInfo()->jsMethod != nullptr);

        InitDisableInlineApply();
        InitDisableInlineSpread();
    }